

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

void __thiscall
duckdb::StrfTimeFormat::ConvertTimestampNSVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  anon_class_16_2_51289818 fun;
  Vector *in_RCX;
  StrfTimeFormat *in_RDX;
  Vector *in_RDI;
  Vector *in_stack_ffffffffffffffc8;
  
  fun.result = in_RCX;
  fun.this = in_RDX;
  UnaryExecutor::
  ExecuteWithNulls<duckdb::timestamp_ns_t,duckdb::string_t,duckdb::StrfTimeFormat::ConvertTimestampNSVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0>
            (in_RDI,in_stack_ffffffffffffffc8,0x13ed3da,fun);
  return;
}

Assistant:

void StrfTimeFormat::ConvertTimestampNSVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::TIMESTAMP_NS);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<timestamp_ns_t, string_t>(
	    input, result, count,
	    [&](timestamp_ns_t input, ValidityMask &mask, idx_t idx) { return ConvertTimestampValue(input, result); });
}